

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O0

void __thiscall
btSequentialImpulseConstraintSolver::resolveSplitPenetrationImpulseCacheFriendly
          (btSequentialImpulseConstraintSolver *this,btSolverBody *body1,btSolverBody *body2,
          btSolverConstraint *c)

{
  float fVar1;
  float fVar2;
  btVector3 *pbVar3;
  btVector3 *in_RCX;
  btSolverBody *in_RDX;
  btSolverBody *in_RSI;
  btScalar bVar4;
  btScalar bVar5;
  btScalar impulseMagnitude;
  btScalar bVar6;
  float fVar7;
  btVector3 bVar8;
  btScalar sum;
  btScalar deltaVel2Dotn;
  btScalar deltaVel1Dotn;
  btScalar deltaImpulse;
  btVector3 *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffffb0 [16];
  btSolverBody *this_00;
  
  if ((in_RCX[8].m_floats[0] != 0.0) || (NAN(in_RCX[8].m_floats[0]))) {
    gNumSplitImpulseRecoveries = gNumSplitImpulseRecoveries + 1;
    fVar7 = in_RCX[8].m_floats[0];
    fVar1 = in_RCX[6].m_floats[0];
    fVar2 = in_RCX[7].m_floats[1];
    pbVar3 = btSolverBody::internalGetPushVelocity(in_RSI);
    bVar4 = btVector3::dot(in_RCX + 1,pbVar3);
    pbVar3 = btSolverBody::internalGetTurnVelocity(in_RSI);
    bVar5 = btVector3::dot(in_RCX,pbVar3);
    pbVar3 = btSolverBody::internalGetPushVelocity(in_RDX);
    impulseMagnitude = btVector3::dot(in_RCX + 3,pbVar3);
    pbVar3 = btSolverBody::internalGetTurnVelocity(in_RDX);
    bVar6 = btVector3::dot(in_RCX + 2,pbVar3);
    fVar7 = in_RCX[6].m_floats[0] +
            -(impulseMagnitude + bVar6) * in_RCX[6].m_floats[3] +
            -(bVar4 + bVar5) * in_RCX[6].m_floats[3] + -fVar1 * fVar2 + fVar7;
    if (in_RCX[7].m_floats[2] <= fVar7) {
      in_RCX[6].m_floats[0] = fVar7;
    }
    else {
      in_RCX[6].m_floats[0] = in_RCX[7].m_floats[2];
    }
    btSolverBody::internalGetInvMass(in_RSI);
    bVar8 = ::operator*(in_stack_ffffffffffffff70,(btVector3 *)in_RSI);
    this_00 = bVar8.m_floats._0_8_;
    btSolverBody::internalApplyPushImpulse
              (this_00,in_stack_ffffffffffffffb0._8_8_,in_stack_ffffffffffffffb0._0_8_,
               impulseMagnitude);
    pbVar3 = in_RCX + 3;
    btSolverBody::internalGetInvMass(in_RDX);
    bVar8 = ::operator*(pbVar3,(btVector3 *)in_RSI);
    btSolverBody::internalApplyPushImpulse
              (this_00,bVar8.m_floats._8_8_,bVar8.m_floats._0_8_,impulseMagnitude);
  }
  return;
}

Assistant:

void	btSequentialImpulseConstraintSolver::resolveSplitPenetrationImpulseCacheFriendly(
        btSolverBody& body1,
        btSolverBody& body2,
        const btSolverConstraint& c)
{
		if (c.m_rhsPenetration)
        {
			gNumSplitImpulseRecoveries++;
			btScalar deltaImpulse = c.m_rhsPenetration-btScalar(c.m_appliedPushImpulse)*c.m_cfm;
			const btScalar deltaVel1Dotn	=	c.m_contactNormal1.dot(body1.internalGetPushVelocity()) 	+ c.m_relpos1CrossNormal.dot(body1.internalGetTurnVelocity());
			const btScalar deltaVel2Dotn	=	c.m_contactNormal2.dot(body2.internalGetPushVelocity())		+ c.m_relpos2CrossNormal.dot(body2.internalGetTurnVelocity());

			deltaImpulse	-=	deltaVel1Dotn*c.m_jacDiagABInv;
			deltaImpulse	-=	deltaVel2Dotn*c.m_jacDiagABInv;
			const btScalar sum = btScalar(c.m_appliedPushImpulse) + deltaImpulse;
			if (sum < c.m_lowerLimit)
			{
				deltaImpulse = c.m_lowerLimit-c.m_appliedPushImpulse;
				c.m_appliedPushImpulse = c.m_lowerLimit;
			}
			else
			{
				c.m_appliedPushImpulse = sum;
			}
			body1.internalApplyPushImpulse(c.m_contactNormal1*body1.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
			body2.internalApplyPushImpulse(c.m_contactNormal2*body2.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
        }
}